

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall Lodtalk::StackMemory::stackOverflow(StackMemory *this)

{
  StackPage *pSVar1;
  Oop OVar2;
  uint8_t *puVar3;
  bool bVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar5;
  Context *currentContext;
  uint8_t *puStack_78;
  uint8_t *local_70;
  uint8_t *newFramePointer;
  uint8_t *dstBeginCopy;
  uint8_t *dstEndCopy;
  long framePointerOffset;
  long copySize;
  uint8_t *srcEndCopy;
  uint8_t *srcBeginCopy;
  StackPage *local_28;
  StackPage *nextPage;
  StackFrame previousFrame;
  StackMemory *this_local;
  
  previousFrame.stackPointer = (uint8_t *)this;
  StackFrame::getPreviousFrame((StackFrame *)&nextPage);
  pSVar1 = this->currentPage;
  (pSVar1->headFrame).framePointer = (uint8_t *)nextPage;
  (pSVar1->headFrame).stackPointer = previousFrame.framePointer;
  local_28 = allocatePage(this);
  if (local_28 == this->currentPage) {
    __assert_fail("nextPage != currentPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0xe0,"void Lodtalk::StackMemory::stackOverflow()");
  }
  StackPage::startUsing(local_28);
  this->currentPage->nextPage = local_28;
  local_28->previousPage = this->currentPage;
  srcEndCopy = StackFrame::getBeginPointer(&this->stackFrame);
  copySize = (long)StackFrame::getEndPointer(&this->stackFrame);
  framePointerOffset = copySize - (long)srcEndCopy;
  dstEndCopy = (this->stackFrame).framePointer + -(long)srcEndCopy;
  dstBeginCopy = local_28->baseFramePointer;
  newFramePointer = dstBeginCopy + -framePointerOffset;
  memcpy(newFramePointer,srcEndCopy,framePointerOffset);
  local_70 = newFramePointer + (long)dstEndCopy;
  StackFrame::StackFrame((StackFrame *)&currentContext,local_70,newFramePointer);
  (this->stackFrame).framePointer = (uint8_t *)currentContext;
  (this->stackFrame).stackPointer = puStack_78;
  StackFrame::~StackFrame((StackFrame *)&currentContext);
  StackFrame::setPrevFramePointer(&this->stackFrame,(uint8_t *)0x0);
  this->currentPage = local_28;
  pSVar1 = this->currentPage;
  puVar3 = (this->stackFrame).stackPointer;
  (pSVar1->headFrame).framePointer = (this->stackFrame).framePointer;
  (pSVar1->headFrame).stackPointer = puVar3;
  this->currentPage->baseFramePointer = (this->stackFrame).framePointer;
  StackFrame::ensureHasUpdatedMarriedSpouse((StackFrame *)&nextPage,this->context);
  StackFrame::ensureHasUpdatedMarriedSpouse(&this->stackFrame,this->context);
  paVar5 = &StackFrame::getThisContext(&this->stackFrame)->field_0;
  OVar2.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar5->uintValue;
  paVar5 = &StackFrame::getThisContext((StackFrame *)&nextPage)->field_0;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)OVar2.field_0 + 8) = *paVar5;
  bVar4 = Oop::isNil((Oop *)((long)OVar2.field_0 + 8));
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    __assert_fail("!currentContext->sender.isNil()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0x101,"void Lodtalk::StackMemory::stackOverflow()");
  }
  StackFrame::~StackFrame((StackFrame *)&nextPage);
  return;
}

Assistant:

void StackMemory::stackOverflow()
{
    // Store the previous frame
    auto previousFrame = stackFrame.getPreviousFrame();
    currentPage->headFrame = previousFrame;

    // Allocate and link the next page.
    auto nextPage = allocatePage();
    assert(nextPage != currentPage);
    nextPage->startUsing();
    currentPage->nextPage = nextPage;
    nextPage->previousPage = currentPage;

    // Get the source pointers and size
    auto srcBeginCopy = stackFrame.getBeginPointer();
    auto srcEndCopy = stackFrame.getEndPointer();
    auto copySize = srcEndCopy - srcBeginCopy;
    auto framePointerOffset = stackFrame.framePointer - srcBeginCopy;

    // Get the destination pointers
    auto dstEndCopy = nextPage->baseFramePointer;
    auto dstBeginCopy = dstEndCopy - copySize;

    // Copy the stack frame
    memcpy(dstBeginCopy, srcBeginCopy, copySize);

    // Use the new stack page
    auto newFramePointer = dstBeginCopy + framePointerOffset;
    stackFrame = StackFrame(newFramePointer, dstBeginCopy);
    stackFrame.setPrevFramePointer(nullptr);
    currentPage = nextPage;
    currentPage->headFrame = stackFrame;
    currentPage->baseFramePointer = stackFrame.framePointer;

    // Make sure they have contexts.
    previousFrame.ensureHasUpdatedMarriedSpouse(context);
    stackFrame.ensureHasUpdatedMarriedSpouse(context);

    // Link the new context with the previous context
    auto currentContext = reinterpret_cast<Context*> (stackFrame.getThisContext().pointer);
    currentContext->sender = previousFrame.getThisContext();
    assert(!currentContext->sender.isNil());
}